

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O0

int Curl_cookie_getlist(Curl_easy *data,CookieInfo *ci,char *host,char *path,_Bool secure,
                       Curl_llist *list)

{
  char *cookie_domain;
  _Bool _Var1;
  _Bool _Var2;
  int iVar3;
  size_t sVar4;
  size_t sVar5;
  void *pvVar6;
  size_t cookie_domain_len;
  void *pvVar7;
  ulong local_78;
  size_t i;
  Cookie **array;
  Cookie *co;
  Curl_llist_node *n;
  size_t myhash;
  ulong uStack_48;
  _Bool is_ip;
  size_t matches;
  Curl_llist *list_local;
  _Bool secure_local;
  char *path_local;
  char *host_local;
  CookieInfo *ci_local;
  Curl_easy *data_local;
  
  uStack_48 = 0;
  sVar4 = cookiehash(host);
  Curl_llist_init(list,(Curl_llist_dtor)0x0);
  if ((ci == (CookieInfo *)0x0) || (sVar5 = Curl_llist_count(ci->cookielist + sVar4), sVar5 == 0)) {
    data_local._4_4_ = 1;
  }
  else {
    remove_expired(ci);
    _Var1 = Curl_host_is_ipnum(host);
    for (co = (Cookie *)Curl_llist_head(ci->cookielist + sVar4); co != (Cookie *)0x0;
        co = (Cookie *)Curl_node_next(&co->node)) {
      pvVar6 = Curl_node_elem(&co->node);
      if (((*(byte *)((long)pvVar6 + 0x74) >> 1 & 1) == 0) || (secure)) {
        if (*(long *)((long)pvVar6 + 0x60) != 0) {
          if (((*(byte *)((long)pvVar6 + 0x74) & 1) != 0) && (!_Var1)) {
            cookie_domain = *(char **)((long)pvVar6 + 0x60);
            cookie_domain_len = strlen(*(char **)((long)pvVar6 + 0x60));
            _Var2 = cookie_tailmatch(cookie_domain,cookie_domain_len,host);
            if (_Var2) goto LAB_001292fa;
          }
          if ((((*(byte *)((long)pvVar6 + 0x74) & 1) != 0) && (!_Var1)) ||
             (iVar3 = curl_strequal(host,*(char **)((long)pvVar6 + 0x60)), iVar3 == 0))
          goto LAB_001293aa;
        }
LAB_001292fa:
        if ((*(long *)((long)pvVar6 + 0x58) == 0) ||
           (_Var2 = pathmatch(*(char **)((long)pvVar6 + 0x58),path), _Var2)) {
          Curl_llist_append(list,pvVar6,(Curl_llist_node *)((long)pvVar6 + 0x20));
          uStack_48 = uStack_48 + 1;
          if (0x95 < uStack_48) {
            if (((data != (Curl_easy *)0x0) &&
                ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0)) &&
               (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)
                ))) {
              Curl_infof(data,"Included max number of cookies (%zu) in request!",uStack_48);
            }
            break;
          }
        }
      }
LAB_001293aa:
    }
    if (uStack_48 != 0) {
      pvVar6 = (*Curl_cmalloc)(uStack_48 << 3);
      if (pvVar6 == (void *)0x0) {
        Curl_llist_destroy(list,(void *)0x0);
        return 2;
      }
      co = (Cookie *)Curl_llist_head(list);
      local_78 = 0;
      while (co != (Cookie *)0x0) {
        pvVar7 = Curl_node_elem(&co->node);
        *(void **)((long)pvVar6 + local_78 * 8) = pvVar7;
        co = (Cookie *)Curl_node_next(&co->node);
        local_78 = local_78 + 1;
      }
      qsort(pvVar6,uStack_48,8,cookie_sort);
      Curl_llist_destroy(list,(void *)0x0);
      for (local_78 = 0; local_78 < uStack_48; local_78 = local_78 + 1) {
        Curl_llist_append(list,*(void **)((long)pvVar6 + local_78 * 8),
                          (Curl_llist_node *)(*(long *)((long)pvVar6 + local_78 * 8) + 0x20));
      }
      (*Curl_cfree)(pvVar6);
    }
    data_local._4_4_ = 0;
  }
  return data_local._4_4_;
}

Assistant:

int Curl_cookie_getlist(struct Curl_easy *data,
                        struct CookieInfo *ci,
                        const char *host, const char *path,
                        bool secure,
                        struct Curl_llist *list)
{
  size_t matches = 0;
  bool is_ip;
  const size_t myhash = cookiehash(host);
  struct Curl_llist_node *n;

  Curl_llist_init(list, NULL);

  if(!ci || !Curl_llist_count(&ci->cookielist[myhash]))
    return 1; /* no cookie struct or no cookies in the struct */

  /* at first, remove expired cookies */
  remove_expired(ci);

  /* check if host is an IP(v4|v6) address */
  is_ip = Curl_host_is_ipnum(host);

  for(n = Curl_llist_head(&ci->cookielist[myhash]);
      n; n = Curl_node_next(n)) {
    struct Cookie *co = Curl_node_elem(n);

    /* if the cookie requires we are secure we must only continue if we are! */
    if(co->secure ? secure : TRUE) {

      /* now check if the domain is correct */
      if(!co->domain ||
         (co->tailmatch && !is_ip &&
          cookie_tailmatch(co->domain, strlen(co->domain), host)) ||
         ((!co->tailmatch || is_ip) && strcasecompare(host, co->domain)) ) {
        /*
         * the right part of the host matches the domain stuff in the
         * cookie data
         */

        /*
         * now check the left part of the path with the cookies path
         * requirement
         */
        if(!co->spath || pathmatch(co->spath, path) ) {

          /*
           * This is a match and we add it to the return-linked-list
           */
          Curl_llist_append(list, co, &co->getnode);
          matches++;
          if(matches >= MAX_COOKIE_SEND_AMOUNT) {
            infof(data, "Included max number of cookies (%zu) in request!",
                  matches);
            break;
          }
        }
      }
    }
  }

  if(matches) {
    /*
     * Now we need to make sure that if there is a name appearing more than
     * once, the longest specified path version comes first. To make this
     * the swiftest way, we just sort them all based on path length.
     */
    struct Cookie **array;
    size_t i;

    /* alloc an array and store all cookie pointers */
    array = malloc(sizeof(struct Cookie *) * matches);
    if(!array)
      goto fail;

    n = Curl_llist_head(list);

    for(i = 0; n; n = Curl_node_next(n))
      array[i++] = Curl_node_elem(n);

    /* now sort the cookie pointers in path length order */
    qsort(array, matches, sizeof(struct Cookie *), cookie_sort);

    /* remake the linked list order according to the new order */
    Curl_llist_destroy(list, NULL);

    for(i = 0; i < matches; i++)
      Curl_llist_append(list, array[i], &array[i]->getnode);

    free(array); /* remove the temporary data again */
  }

  return 0; /* success */

fail:
  /* failure, clear up the allocated chain and return NULL */
  Curl_llist_destroy(list, NULL);
  return 2; /* error */
}